

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH64_endian_align(xxh_u8 *input,size_t len,xxh_u64 seed,XXH_alignment align)

{
  xxh_u64 xVar1;
  void *pvVar2;
  xxh_u64 xVar3;
  xxh_u64 in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  xxh_u64 v4;
  xxh_u64 v3;
  xxh_u64 v2;
  xxh_u64 v1;
  xxh_u8 *limit;
  xxh_u64 h64;
  xxh_u8 *bEnd;
  undefined4 in_stack_00000058;
  xxh_u64 local_58;
  xxh_u64 local_50;
  xxh_u64 local_48;
  void *local_40;
  ulong local_8;
  
  if (0x1f < in_RSI) {
    local_58 = in_RDX + 0x61c8864e7a143579;
    local_50 = in_RDX;
    xVar1 = in_RDX + 0xc2b2ae3d27d4eb4f;
    pvVar2 = (void *)(in_RDX + 0x60ea27eeadc0b5d6);
    local_8 = in_RDI;
    do {
      local_40 = pvVar2;
      local_48 = xVar1;
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      pvVar2 = (void *)XXH64_round((xxh_u64)local_40,xVar1);
      xVar1 = XXH_readLE64_align(local_40,XXH_aligned);
      xVar1 = XXH64_round(local_48,xVar1);
      xVar3 = XXH_readLE64_align(local_40,XXH_aligned);
      local_50 = XXH64_round(local_50,xVar3);
      xVar3 = XXH_readLE64_align(local_40,XXH_aligned);
      local_58 = XXH64_round(local_58,xVar3);
      local_8 = local_8 + 0x20;
    } while (local_8 <= (in_RDI + in_RSI) - 0x20);
    XXH64_mergeRound(local_48,(xxh_u64)local_40);
    XXH64_mergeRound(local_48,(xxh_u64)local_40);
    XXH64_mergeRound(local_48,(xxh_u64)local_40);
    XXH64_mergeRound(local_48,(xxh_u64)local_40);
  }
  xVar1 = XXH64_finalize(len,(xxh_u8 *)seed,CONCAT44(align,in_stack_00000058),bEnd._4_4_);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE xxh_u64 XXH64_endian_align(const xxh_u8* input, size_t len,
                                            xxh_u64 seed, XXH_alignment align) {
  const xxh_u8* bEnd = input + len;
  xxh_u64 h64;

#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && \
    (XXH_ACCEPT_NULL_INPUT_POINTER >= 1)
  if (input == NULL) {
    len = 0;
    bEnd = input = (const xxh_u8*)(size_t)32;
  }
#endif

  if (len >= 32) {
    const xxh_u8* const limit = bEnd - 32;
    xxh_u64 v1 = seed + XXH_PRIME64_1 + XXH_PRIME64_2;
    xxh_u64 v2 = seed + XXH_PRIME64_2;
    xxh_u64 v3 = seed + 0;
    xxh_u64 v4 = seed - XXH_PRIME64_1;

    do {
      v1 = XXH64_round(v1, XXH_get64bits(input));
      input += 8;
      v2 = XXH64_round(v2, XXH_get64bits(input));
      input += 8;
      v3 = XXH64_round(v3, XXH_get64bits(input));
      input += 8;
      v4 = XXH64_round(v4, XXH_get64bits(input));
      input += 8;
    } while (input <= limit);

    h64 = XXH_rotl64(v1, 1) + XXH_rotl64(v2, 7) + XXH_rotl64(v3, 12) +
          XXH_rotl64(v4, 18);
    h64 = XXH64_mergeRound(h64, v1);
    h64 = XXH64_mergeRound(h64, v2);
    h64 = XXH64_mergeRound(h64, v3);
    h64 = XXH64_mergeRound(h64, v4);

  } else {
    h64 = seed + XXH_PRIME64_5;
  }

  h64 += (xxh_u64)len;

  return XXH64_finalize(h64, input, len, align);
}